

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O1

void masked_variance4xh(uint8_t *src_ptr,int src_stride,uint8_t *a_ptr,uint8_t *b_ptr,uint8_t *m_ptr
                       ,int m_stride,int height,uint *sse,int *sum_)

{
  uint8_t *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  unkuint9 Var19;
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  long lVar22;
  long lVar23;
  long lVar24;
  short sVar25;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  undefined1 auVar26 [16];
  short sVar35;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar37;
  int iVar38;
  undefined1 auVar36 [16];
  int iVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  short sVar42;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  undefined1 auVar43 [16];
  undefined1 auVar51 [16];
  short sVar59;
  undefined1 auVar52 [16];
  undefined1 auVar60 [16];
  char cVar70;
  char cVar71;
  char cVar72;
  char cVar73;
  char cVar74;
  char cVar75;
  char cVar76;
  char cVar77;
  char cVar78;
  char cVar79;
  char cVar80;
  char cVar81;
  undefined1 auVar69 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  
  if (height < 1) {
    auVar36 = (undefined1  [16])0x0;
    auVar26 = (undefined1  [16])0x0;
  }
  else {
    lVar22 = (long)src_stride;
    lVar23 = (long)m_stride;
    lVar24 = 0;
    auVar36 = (undefined1  [16])0x0;
    auVar28 = (undefined1  [16])0x0;
    do {
      uVar4 = *(undefined4 *)(src_ptr + lVar22);
      uVar5 = *(undefined4 *)src_ptr;
      uVar40 = CONCAT44(uVar4,uVar5);
      uVar2 = *(undefined4 *)(src_ptr + lVar22 * 2);
      uVar3 = *(undefined4 *)(src_ptr + lVar22 * 3);
      auVar26 = *(undefined1 (*) [16])(a_ptr + lVar24 * 4);
      puVar1 = b_ptr + lVar24 * 4;
      uVar6 = *(undefined4 *)(m_ptr + lVar23 * 3);
      uVar7 = *(undefined4 *)(m_ptr + lVar23 * 2);
      uVar8 = *(undefined4 *)(m_ptr + lVar23);
      uVar9 = *(undefined4 *)m_ptr;
      auVar62._0_8_ = CONCAT44(uVar8,uVar9);
      cVar70 = (char)((uint)uVar9 >> 8);
      cVar71 = (char)((uint)uVar9 >> 0x10);
      cVar72 = (char)((uint)uVar9 >> 0x18);
      cVar73 = (char)((uint)uVar8 >> 8);
      cVar74 = (char)((uint)uVar8 >> 0x10);
      cVar75 = (char)((uint)uVar8 >> 0x18);
      cVar76 = (char)((uint)uVar7 >> 8);
      cVar77 = (char)((uint)uVar7 >> 0x10);
      cVar78 = (char)((uint)uVar7 >> 0x18);
      cVar79 = (char)((uint)uVar6 >> 8);
      cVar80 = (char)((uint)uVar6 >> 0x10);
      cVar81 = (char)((uint)uVar6 >> 0x18);
      auVar50._0_14_ = auVar26._0_14_;
      auVar50[0xe] = auVar26[7];
      auVar50[0xf] = puVar1[7];
      auVar49._14_2_ = auVar50._14_2_;
      auVar49._0_13_ = auVar26._0_13_;
      auVar49[0xd] = puVar1[6];
      auVar48._13_3_ = auVar49._13_3_;
      auVar48._0_12_ = auVar26._0_12_;
      auVar48[0xc] = auVar26[6];
      auVar47._12_4_ = auVar48._12_4_;
      auVar47._0_11_ = auVar26._0_11_;
      auVar47[0xb] = puVar1[5];
      auVar46._11_5_ = auVar47._11_5_;
      auVar46._0_10_ = auVar26._0_10_;
      auVar46[10] = auVar26[5];
      auVar45._10_6_ = auVar46._10_6_;
      auVar45._0_9_ = auVar26._0_9_;
      auVar45[9] = puVar1[4];
      auVar44._9_7_ = auVar45._9_7_;
      auVar44._0_8_ = auVar26._0_8_;
      auVar44[8] = auVar26[4];
      auVar43._8_8_ = auVar44._8_8_;
      auVar43[7] = puVar1[3];
      auVar43[6] = auVar26[3];
      auVar43[5] = puVar1[2];
      auVar43[4] = auVar26[2];
      auVar43[3] = puVar1[1];
      auVar43[2] = auVar26[1];
      auVar43[0] = auVar26[0];
      auVar43[1] = *puVar1;
      auVar68._8_6_ = 0;
      auVar68._0_8_ = auVar62._0_8_;
      auVar68[0xe] = cVar75;
      auVar68[0xf] = '@' - cVar75;
      auVar67._14_2_ = auVar68._14_2_;
      auVar67._8_5_ = 0;
      auVar67._0_8_ = auVar62._0_8_;
      auVar67[0xd] = '@' - cVar74;
      auVar66._13_3_ = auVar67._13_3_;
      auVar66._8_4_ = 0;
      auVar66._0_8_ = auVar62._0_8_;
      auVar66[0xc] = cVar74;
      auVar65._12_4_ = auVar66._12_4_;
      auVar65._8_3_ = 0;
      auVar65._0_8_ = auVar62._0_8_;
      auVar65[0xb] = '@' - cVar73;
      auVar64._11_5_ = auVar65._11_5_;
      auVar64._8_2_ = 0;
      auVar64._0_8_ = auVar62._0_8_;
      auVar64[10] = cVar73;
      auVar63._10_6_ = auVar64._10_6_;
      auVar63[8] = 0;
      auVar63._0_8_ = auVar62._0_8_;
      auVar63[9] = '@' - (char)uVar8;
      auVar62._9_7_ = auVar63._9_7_;
      auVar62[8] = (char)uVar8;
      auVar61._8_8_ = auVar62._8_8_;
      auVar61[7] = '@' - cVar72;
      auVar61[6] = cVar72;
      auVar61[5] = '@' - cVar71;
      auVar61[4] = cVar71;
      auVar61._0_4_ = uVar9;
      auVar60._4_12_ = auVar61._4_12_;
      auVar60[3] = '@' - cVar70;
      auVar60[2] = cVar70;
      auVar60[1] = '@' - (char)uVar9;
      auVar60[0] = (char)uVar9;
      auVar51 = pmaddubsw(auVar43,auVar60);
      sVar42 = pavgw(auVar51._0_2_ >> 5,0);
      sVar53 = pavgw(auVar51._2_2_ >> 5,0);
      sVar54 = pavgw(auVar51._4_2_ >> 5,0);
      sVar55 = pavgw(auVar51._6_2_ >> 5,0);
      sVar56 = pavgw(auVar51._8_2_ >> 5,0);
      sVar57 = pavgw(auVar51._10_2_ >> 5,0);
      sVar58 = pavgw(auVar51._12_2_ >> 5,0);
      sVar59 = pavgw(auVar51._14_2_ >> 5,0);
      auVar51[1] = puVar1[8];
      auVar51[0] = auVar26[8];
      auVar51[2] = auVar26[9];
      auVar51[3] = puVar1[9];
      auVar51[4] = auVar26[10];
      auVar51[5] = puVar1[10];
      auVar51[6] = auVar26[0xb];
      auVar51[7] = puVar1[0xb];
      auVar51[8] = auVar26[0xc];
      auVar51[9] = puVar1[0xc];
      auVar51[10] = auVar26[0xd];
      auVar51[0xb] = puVar1[0xd];
      auVar51[0xc] = auVar26[0xe];
      auVar51[0xd] = puVar1[0xe];
      auVar51[0xe] = auVar26[0xf];
      auVar51[0xf] = puVar1[0xf];
      auVar69[1] = '@' - (char)uVar7;
      auVar69[0] = (char)uVar7;
      auVar69[2] = cVar76;
      auVar69[3] = '@' - cVar76;
      auVar69[4] = cVar77;
      auVar69[5] = '@' - cVar77;
      auVar69[6] = cVar78;
      auVar69[7] = '@' - cVar78;
      auVar69[8] = (char)uVar6;
      auVar69[9] = '@' - (char)uVar6;
      auVar69[10] = cVar79;
      auVar69[0xb] = '@' - cVar79;
      auVar69[0xc] = cVar80;
      auVar69[0xd] = '@' - cVar80;
      auVar69[0xe] = cVar81;
      auVar69[0xf] = '@' - cVar81;
      auVar26 = pmaddubsw(auVar51,auVar69);
      sVar25 = pavgw(auVar26._0_2_ >> 5,0);
      sVar29 = pavgw(auVar26._2_2_ >> 5,0);
      sVar30 = pavgw(auVar26._4_2_ >> 5,0);
      sVar31 = pavgw(auVar26._6_2_ >> 5,0);
      sVar32 = pavgw(auVar26._8_2_ >> 5,0);
      sVar33 = pavgw(auVar26._10_2_ >> 5,0);
      sVar34 = pavgw(auVar26._12_2_ >> 5,0);
      sVar35 = pavgw(auVar26._14_2_ >> 5,0);
      auVar10._8_6_ = 0;
      auVar10._0_8_ = uVar40;
      auVar10[0xe] = (char)((uint)uVar4 >> 0x18);
      auVar11._8_4_ = 0;
      auVar11._0_8_ = uVar40;
      auVar11[0xc] = (char)((uint)uVar4 >> 0x10);
      auVar11._13_2_ = auVar10._13_2_;
      auVar12._8_4_ = 0;
      auVar12._0_8_ = uVar40;
      auVar12._12_3_ = auVar11._12_3_;
      auVar13._8_2_ = 0;
      auVar13._0_8_ = uVar40;
      auVar13[10] = (char)((uint)uVar4 >> 8);
      auVar13._11_4_ = auVar12._11_4_;
      auVar14._8_2_ = 0;
      auVar14._0_8_ = uVar40;
      auVar14._10_5_ = auVar13._10_5_;
      auVar15[8] = (char)uVar4;
      auVar15._0_8_ = uVar40;
      auVar15._9_6_ = auVar14._9_6_;
      auVar18._7_8_ = 0;
      auVar18._0_7_ = auVar15._8_7_;
      Var19 = CONCAT81(SUB158(auVar18 << 0x40,7),(char)((uint)uVar5 >> 0x18));
      auVar21._9_6_ = 0;
      auVar21._0_9_ = Var19;
      auVar16[4] = (char)((uint)uVar5 >> 0x10);
      auVar16._0_4_ = uVar5;
      auVar16._5_10_ = SUB1510(auVar21 << 0x30,5);
      auVar20._11_4_ = 0;
      auVar20._0_11_ = auVar16._4_11_;
      auVar17[2] = (char)((uint)uVar5 >> 8);
      auVar17._0_2_ = (ushort)uVar5;
      auVar17._3_12_ = SUB1512(auVar20 << 0x20,3);
      auVar52._0_2_ = sVar42 - ((ushort)uVar5 & 0xff);
      auVar52._2_2_ = sVar53 - auVar17._2_2_;
      auVar52._4_2_ = sVar54 - auVar16._4_2_;
      auVar52._6_2_ = sVar55 - (short)Var19;
      auVar52._8_2_ = sVar56 - auVar15._8_2_;
      auVar52._10_2_ = sVar57 - auVar13._10_2_;
      auVar52._12_2_ = sVar58 - auVar11._12_2_;
      auVar52._14_2_ = sVar59 - (auVar10._13_2_ >> 8);
      auVar27._0_2_ = sVar25 - (ushort)(byte)uVar2;
      auVar27._2_2_ = sVar29 - (ushort)(byte)((uint)uVar2 >> 8);
      auVar27._4_2_ = sVar30 - (ushort)(byte)((uint)uVar2 >> 0x10);
      auVar27._6_2_ = sVar31 - (ushort)(byte)((uint)uVar2 >> 0x18);
      auVar27._8_2_ = sVar32 - (ushort)(byte)uVar3;
      auVar27._10_2_ = sVar33 - (ushort)(byte)((uint)uVar3 >> 8);
      auVar27._12_2_ = sVar34 - (ushort)(byte)((uint)uVar3 >> 0x10);
      auVar27._14_2_ = sVar35 - (ushort)(byte)((uint)uVar3 >> 0x18);
      auVar41._0_2_ = auVar27._0_2_ + auVar52._0_2_;
      auVar41._2_2_ = auVar27._2_2_ + auVar52._2_2_;
      auVar41._4_2_ = auVar27._4_2_ + auVar52._4_2_;
      auVar41._6_2_ = auVar27._6_2_ + auVar52._6_2_;
      auVar41._8_2_ = auVar27._8_2_ + auVar52._8_2_;
      auVar41._10_2_ = auVar27._10_2_ + auVar52._10_2_;
      auVar41._12_2_ = auVar27._12_2_ + auVar52._12_2_;
      auVar41._14_2_ = auVar27._14_2_ + auVar52._14_2_;
      auVar51 = pmaddwd(auVar41,_DAT_0051e8d0);
      auVar26._0_4_ = auVar28._0_4_ + auVar51._0_4_;
      auVar26._4_4_ = auVar28._4_4_ + auVar51._4_4_;
      auVar26._8_4_ = auVar28._8_4_ + auVar51._8_4_;
      auVar26._12_4_ = auVar28._12_4_ + auVar51._12_4_;
      auVar51 = pmaddwd(auVar52,auVar52);
      iVar37 = auVar36._4_4_;
      iVar38 = auVar36._8_4_;
      iVar39 = auVar36._12_4_;
      auVar28 = pmaddwd(auVar27,auVar27);
      auVar36._0_4_ = auVar28._0_4_ + auVar51._0_4_ + auVar36._0_4_;
      auVar36._4_4_ = auVar28._4_4_ + auVar51._4_4_ + iVar37;
      auVar36._8_4_ = auVar28._8_4_ + auVar51._8_4_ + iVar38;
      auVar36._12_4_ = auVar28._12_4_ + auVar51._12_4_ + iVar39;
      src_ptr = src_ptr + src_stride * 4;
      m_ptr = m_ptr + m_stride * 4;
      lVar24 = lVar24 + 4;
      auVar28 = auVar26;
    } while ((int)lVar24 < height);
  }
  auVar26 = phaddd(auVar26,auVar36);
  auVar26 = phaddd(auVar26,auVar26);
  *sum_ = auVar26._0_4_;
  auVar26 = phaddd(auVar36,auVar36);
  auVar26 = phaddd(auVar26,auVar26);
  *sse = auVar26._0_4_;
  return;
}

Assistant:

static void masked_variance4xh(const uint8_t *src_ptr, int src_stride,
                               const uint8_t *a_ptr, const uint8_t *b_ptr,
                               const uint8_t *m_ptr, int m_stride, int height,
                               unsigned int *sse, int *sum_) {
  int y;
  __m128i sum = _mm_setzero_si128(), sum_sq = _mm_setzero_si128();

  for (y = 0; y < height; y += 4) {
    // Load four rows at a time
    __m128i src = _mm_setr_epi32(*(int *)src_ptr, *(int *)&src_ptr[src_stride],
                                 *(int *)&src_ptr[src_stride * 2],
                                 *(int *)&src_ptr[src_stride * 3]);
    const __m128i a = _mm_loadu_si128((const __m128i *)a_ptr);
    const __m128i b = _mm_loadu_si128((const __m128i *)b_ptr);
    const __m128i m = _mm_setr_epi32(*(int *)m_ptr, *(int *)&m_ptr[m_stride],
                                     *(int *)&m_ptr[m_stride * 2],
                                     *(int *)&m_ptr[m_stride * 3]);
    accumulate_block(&src, &a, &b, &m, &sum, &sum_sq);

    src_ptr += src_stride * 4;
    a_ptr += 16;
    b_ptr += 16;
    m_ptr += m_stride * 4;
  }
  // Reduce down to a single sum and sum of squares
  sum = _mm_hadd_epi32(sum, sum_sq);
  sum = _mm_hadd_epi32(sum, sum);
  *sum_ = _mm_cvtsi128_si32(sum);
  *sse = (unsigned int)_mm_cvtsi128_si32(_mm_srli_si128(sum, 4));
}